

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall
nuraft::raft_server::on_retryable_req_err(raft_server *this,ptr<peer> *p,ptr<req_msg> *req)

{
  atomic<bool> *paVar1;
  element_type *peVar2;
  int iVar3;
  msg_type type;
  bool bVar4;
  ptr<peer> local_78;
  string local_68;
  string local_48;
  
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2 != (element_type *)0x0) &&
     (iVar3 = (**(code **)(*(long *)peVar2 + 0x38))(), 4 < iVar3)) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_type_to_string_abi_cxx11_
              (&local_48,
               (nuraft *)
               (ulong)(((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->super_msg_base).type_,type);
    msg_if_given_abi_cxx11_
              (&local_68,"retry the request %s for %d",local_48._M_dataplus._M_p,
               (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->config_).
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id_);
    (**(code **)(*(long *)peVar2 + 0x40))
              (peVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
               ,"on_retryable_req_err",0x5e9,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  paVar1 = &((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->busy_flag_;
  LOCK();
  bVar4 = (paVar1->_M_base)._M_i == false;
  if (bVar4) {
    (paVar1->_M_base)._M_i = true;
  }
  UNLOCK();
  if (bVar4) {
    local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    peer::send_req(local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &local_78,req,&this->ex_resp_handler_);
    if (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  else {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar3 = (**(code **)(*(long *)peVar2 + 0x38))(), 1 < iVar3)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_68,"retry request %d failed: peer %d is busy",
                 (ulong)(((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_msg_base).type_,
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"on_retryable_req_err",0x5ee,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void raft_server::on_retryable_req_err(ptr<peer>& p, ptr<req_msg>& req) {
    p_db( "retry the request %s for %d",
          msg_type_to_string(req->get_type()).c_str(), p->get_id() );
    if (p->make_busy()) {
        p->send_req(p, req, ex_resp_handler_);
    } else {
        p_er("retry request %d failed: peer %d is busy",
             req->get_type(), p->get_id());
    }
}